

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnTryExpr(BinaryReaderIR *this,Type sig_type)

{
  bool bVar1;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_40;
  Enum local_38;
  Enum local_34;
  ExprList *local_30;
  ExprList *expr_list;
  TryExpr *expr;
  unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> expr_ptr;
  BinaryReaderIR *this_local;
  Type sig_type_local;
  
  expr_ptr._M_t.super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>.
  super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::TryExpr,_std::default_delete<wabt::TryExpr>,_true,_true>)
       (__uniq_ptr_data<wabt::TryExpr,_std::default_delete<wabt::TryExpr>,_true,_true>)this;
  this_local._0_4_ = sig_type.enum_;
  MakeUnique<wabt::TryExpr>();
  expr_list = (ExprList *)
              std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::get
                        ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)&expr);
  local_30 = &(((pointer)expr_list)->block).exprs;
  local_34 = this_local._0_4_;
  SetBlockDeclaration(this,&(((pointer)expr_list)->block).decl,this_local._0_4_);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::TryExpr,std::default_delete<wabt::TryExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_40,
             (unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)&expr);
  local_38 = (Enum)AppendExpr(this,&local_40);
  bVar1 = Failed((Result)local_38);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_40);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    PushLabel(this,Try,local_30,(Expr *)expr_list);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::~unique_ptr
            ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)&expr);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnTryExpr(Type sig_type) {
  auto expr_ptr = MakeUnique<TryExpr>();
  // Save expr so it can be used below, after expr_ptr has been moved.
  TryExpr* expr = expr_ptr.get();
  ExprList* expr_list = &expr->block.exprs;
  SetBlockDeclaration(&expr->block.decl, sig_type);
  CHECK_RESULT(AppendExpr(std::move(expr_ptr)));
  PushLabel(LabelType::Try, expr_list, expr);
  return Result::Ok;
}